

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value_list.cpp
# Opt level: O0

void __thiscall Am_Value_List::Move_Nth(Am_Value_List *this,int index)

{
  ostream *poVar1;
  void *this_00;
  int local_24;
  Am_List_Item *pAStack_20;
  int i;
  Am_List_Item *this_item;
  int index_local;
  Am_Value_List *this_local;
  
  if (this->data == (Am_Value_List_Data *)0x0) {
    Am_Error("Value list is empty in Move_Nth");
  }
  pAStack_20 = this->data->head;
  if ((int)(uint)*(ushort *)&(this->data->super_Am_Wrapper).field_0xc <= index) {
    poVar1 = std::operator<<((ostream *)&std::cerr,"** Amulet_Error: ");
    poVar1 = std::operator<<(poVar1,"Value list is too short, len = ");
    poVar1 = (ostream *)
             std::ostream::operator<<(poVar1,*(ushort *)&(this->data->super_Am_Wrapper).field_0xc);
    poVar1 = std::operator<<(poVar1," but requested ");
    this_00 = (void *)std::ostream::operator<<(poVar1,index);
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    Am_Error();
  }
  for (local_24 = 0; local_24 < index; local_24 = local_24 + 1) {
    pAStack_20 = pAStack_20->next;
  }
  this->item = pAStack_20;
  return;
}

Assistant:

void
Am_Value_List::Move_Nth(int index)
{
  if (!data)
    Am_Error("Value list is empty in Move_Nth");
  Am_List_Item *this_item = data->head;
  if (index >= data->number)
    Am_ERROR("Value list is too short, len = " << data->number
                                               << " but requested " << index);
  for (int i = 0; i < index; i++) {
    this_item = this_item->next;
  }
  item = this_item;
}